

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

string * __thiscall
font2svg::glyph::svgborder_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *this_00;
  ostream *poVar1;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  this_00 = &this->field_0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n\n <!-- draw border -->",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n <rect fill=\'none\' stroke=\'black\'",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," width=\'",8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->bbwidth + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," height=\'",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'/>",3);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgborder()  {
		tmp.str("");
		tmp << "\n\n <!-- draw border -->";

		tmp << "\n <rect fill='none' stroke='black'"
			<< " width='" << bbwidth - 1 << "'"
			<< " height='" << bbheight - 1 << "'/>";
		return tmp.str();
	}